

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O1

void __thiscall QStyleOptionProgressBar::QStyleOptionProgressBar(QStyleOptionProgressBar *this)

{
  State *pSVar1;
  
  QStyleOption::QStyleOption(&this->super_QStyleOption,1,6);
  this->minimum = 0;
  this->maximum = 0;
  this->progress = 0;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  (this->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 1;
  this->textVisible = false;
  this->invertedAppearance = false;
  this->bottomToTop = false;
  pSVar1 = &(this->super_QStyleOption).state;
  *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
            super_QFlagsStorage<QStyle::StateFlag>.i =
       (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
             super_QFlagsStorage<QStyle::StateFlag>.i | 0x80;
  return;
}

Assistant:

QStyleOptionProgressBar::QStyleOptionProgressBar()
    : QStyleOptionProgressBar(QStyleOptionProgressBar::Version)
{
}